

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O1

void __thiscall CConsole::AddCommandSorted(CConsole *this,CCommand *pCommand)

{
  int iVar1;
  CCommand *pCVar2;
  CCommand **ppCVar3;
  
  ppCVar3 = &this->m_pFirstCommand;
  if ((this->m_pFirstCommand == (CCommand *)0x0) ||
     (iVar1 = str_comp((pCommand->super_CCommandInfo).m_pName,
                       (this->m_pFirstCommand->super_CCommandInfo).m_pName), iVar1 < 1)) {
    pCVar2 = *ppCVar3;
    if ((pCVar2 == (CCommand *)0x0) || (pCVar2->m_pNext == (CCommand *)0x0)) {
      pCVar2 = (CCommand *)0x0;
    }
  }
  else {
    do {
      pCVar2 = *ppCVar3;
      if (pCVar2 == (CCommand *)0x0) {
        return;
      }
      ppCVar3 = &pCVar2->m_pNext;
    } while ((pCVar2->m_pNext != (CCommand *)0x0) &&
            (iVar1 = str_comp((pCommand->super_CCommandInfo).m_pName,
                              (pCVar2->m_pNext->super_CCommandInfo).m_pName), 0 < iVar1));
    pCVar2 = *ppCVar3;
  }
  pCommand->m_pNext = pCVar2;
  *ppCVar3 = pCommand;
  return;
}

Assistant:

void CConsole::AddCommandSorted(CCommand *pCommand)
{
	if(!m_pFirstCommand || str_comp(pCommand->m_pName, m_pFirstCommand->m_pName) <= 0)
	{
		if(m_pFirstCommand && m_pFirstCommand->m_pNext)
			pCommand->m_pNext = m_pFirstCommand;
		else
			pCommand->m_pNext = 0;
		m_pFirstCommand = pCommand;
	}
	else
	{
		for(CCommand *p = m_pFirstCommand; p; p = p->m_pNext)
		{
			if(!p->m_pNext || str_comp(pCommand->m_pName, p->m_pNext->m_pName) <= 0)
			{
				pCommand->m_pNext = p->m_pNext;
				p->m_pNext = pCommand;
				break;
			}
		}
	}
}